

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O3

void __thiscall tst_qpromise_then::functionPtrHandlers(tst_qpromise_then *this)

{
  QSharedData *pQVar1;
  anon_class_24_3_5928a092 callback;
  anon_class_24_3_5928a092 callback_00;
  anon_class_24_3_5928a092 callback_01;
  anon_class_24_3_5928a092 callback_02;
  anon_class_24_3_5928a092 callback_03;
  anon_class_24_3_5928a092 callback_04;
  _func_int **pp_Var2;
  bool bVar3;
  char cVar4;
  float *in_RSI;
  float *pfVar5;
  float fVar6;
  Promise p2;
  Promise p1;
  Promise p0;
  QPromiseBase<float> local_a0;
  QPromiseBase<float> local_90;
  QPromiseBase<float> local_80;
  QPromiseBase<float> *local_70;
  QPromiseBase<float> *pQStack_68;
  QPromiseBase<float> *local_60;
  QPromiseBase<float> local_58;
  code *local_48;
  _func_int **local_40;
  code *local_38;
  
  QtPromise::resolve();
  local_58._vptr_QPromiseBase = (_func_int **)anon_unknown.dwarf_21059::fnNoArg;
  local_60 = &local_a0;
  local_a0._vptr_QPromiseBase = (_func_int **)0x0;
  callback.fulfilled = (_func_float **)&local_58;
  callback.this = (QPromiseBase<void> *)&local_90;
  callback.rejected = &local_60->_vptr_QPromiseBase;
  local_70 = &local_90;
  pQStack_68 = &local_58;
  QtPromise::QPromiseBase<float>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_80,callback);
  local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133b38;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)local_90.m_d.d);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)local_90.m_d.d);
  }
  local_90._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133688;
  if (local_90.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_90.m_d.d != (PromiseData<float> *)0x0)) {
      (*((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  QtPromise::resolve<float_const&>((float *)&local_a0);
  local_48 = anon_unknown.dwarf_21059::fnArgByVal;
  local_58._vptr_QPromiseBase = (_func_int **)0x0;
  callback_00.fulfilled = &local_48;
  callback_00.this = &local_a0;
  callback_00.rejected = &local_58._vptr_QPromiseBase;
  local_70 = &local_a0;
  pQStack_68 = (QPromiseBase<float> *)&local_48;
  local_60 = &local_58;
  QtPromise::QPromiseBase<float>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_90,callback_00);
  local_90._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133b38;
  bVar3 = QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::isPending
                    (&(local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::dispatch
              (&(local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
  }
  local_a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
  if (local_a0.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_a0.m_d.d != (PromiseData<float> *)0x0)) {
      (*((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  QtPromise::resolve<float_const&>((float *)&local_58);
  local_38 = anon_unknown.dwarf_21059::fnArgByRef;
  local_48 = (code *)0x0;
  callback_01.fulfilled = &local_38;
  callback_01.this = &local_58;
  callback_01.rejected = &local_48;
  local_70 = &local_58;
  pQStack_68 = (QPromiseBase<float> *)&local_38;
  local_60 = (QPromiseBase<float> *)&local_48;
  QtPromise::QPromiseBase<float>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_a0,callback_01);
  local_a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133b38;
  bVar3 = QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::isPending
                    (&(local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::dispatch
              (&(local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
  }
  local_58._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
  if (local_58.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_58.m_d.d != (PromiseData<float> *)0x0)) {
      (*((local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  fVar6 = waitForValue<float>((QPromise<float> *)&local_80,in_RSI);
  pfVar5 = (float *)&(anonymous_namespace)::kRes;
  local_70._0_4_ = fVar6;
  cVar4 = QTest::qCompare((float *)&local_70,(float *)&(anonymous_namespace)::kRes,
                          "waitForValue(p0, kFail)","kRes",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xbc);
  local_40 = (_func_int **)&PTR__QPromiseBase_00133688;
  if (cVar4 != '\0') {
    local_70._0_4_ = waitForValue<float>((QPromise<float> *)&local_90,pfVar5);
    pfVar5 = (float *)&(anonymous_namespace)::kRes;
    cVar4 = QTest::qCompare((float *)&local_70,(float *)&(anonymous_namespace)::kRes,
                            "waitForValue(p1, kFail)","kRes",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xbd);
    if (cVar4 != '\0') {
      local_70._0_4_ = waitForValue<float>((QPromise<float> *)&local_a0,pfVar5);
      pfVar5 = (float *)&(anonymous_namespace)::kRes;
      cVar4 = QTest::qCompare((float *)&local_70,(float *)&(anonymous_namespace)::kRes,
                              "waitForValue(p2, kFail)","kRes",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                              ,0xbe);
      goto LAB_0010b01f;
    }
  }
  cVar4 = '\0';
LAB_0010b01f:
  local_a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
  if (local_a0.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_a0.m_d.d != (PromiseData<float> *)0x0)) {
      (*((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  local_90._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
  if (local_90.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_90.m_d.d != (PromiseData<float> *)0x0)) {
      (*((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
  if (local_80.m_d.d != (PromiseData<float> *)0x0) {
    LOCK();
    pQVar1 = &((local_80.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_80.m_d.d != (PromiseData<float> *)0x0)) {
      (*((local_80.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  if (cVar4 != '\0') {
    QtPromise::resolve();
    local_58._vptr_QPromiseBase = (_func_int **)anon_unknown.dwarf_21059::Klass::kFnNoArg;
    local_a0._vptr_QPromiseBase = (_func_int **)0x0;
    callback_02.fulfilled = (_func_float **)&local_58;
    callback_02.this = (QPromiseBase<void> *)&local_90;
    callback_02.rejected = &local_a0._vptr_QPromiseBase;
    local_70 = &local_90;
    pQStack_68 = &local_58;
    local_60 = &local_a0;
    QtPromise::QPromiseBase<float>::
    QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
              (&local_80,callback_02);
    pp_Var2 = local_40;
    local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133b38;
    bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      ((PromiseDataBase<void,_void_()> *)local_90.m_d.d);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
                ((PromiseDataBase<void,_void_()> *)local_90.m_d.d);
    }
    local_90._vptr_QPromiseBase = pp_Var2;
    if (local_90.m_d.d != (PromiseData<float> *)0x0) {
      LOCK();
      pQVar1 = &((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_90.m_d.d != (PromiseData<float> *)0x0)) {
        (*((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
    QtPromise::resolve<float_const&>((float *)&local_a0);
    local_48 = anon_unknown.dwarf_21059::Klass::kFnArgByVal;
    local_58._vptr_QPromiseBase = (_func_int **)0x0;
    callback_03.fulfilled = &local_48;
    callback_03.this = &local_a0;
    callback_03.rejected = &local_58._vptr_QPromiseBase;
    local_70 = &local_a0;
    pQStack_68 = (QPromiseBase<float> *)&local_48;
    local_60 = &local_58;
    QtPromise::QPromiseBase<float>::
    QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
              (&local_90,callback_03);
    local_90._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133b38;
    bVar3 = QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::isPending
                      (&(local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::dispatch
                (&(local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
    }
    local_a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
    if (local_a0.m_d.d != (PromiseData<float> *)0x0) {
      LOCK();
      pQVar1 = &((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_a0.m_d.d != (PromiseData<float> *)0x0)) {
        (*((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
    QtPromise::resolve<float_const&>((float *)&local_58);
    local_38 = anon_unknown.dwarf_21059::Klass::kFnArgByRef;
    local_48 = (code *)0x0;
    callback_04.fulfilled = &local_38;
    callback_04.this = &local_58;
    callback_04.rejected = &local_48;
    local_70 = &local_58;
    pQStack_68 = (QPromiseBase<float> *)&local_38;
    local_60 = (QPromiseBase<float> *)&local_48;
    QtPromise::QPromiseBase<float>::
    QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
              (&local_a0,callback_04);
    local_a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00133b38;
    bVar3 = QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::isPending
                      (&(local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<float,_void_(const_float_&)>::dispatch
                (&(local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>);
    }
    local_58._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
    if (local_58.m_d.d != (PromiseData<float> *)0x0) {
      LOCK();
      pQVar1 = &((local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_58.m_d.d != (PromiseData<float> *)0x0)) {
        (*((local_58.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
    fVar6 = waitForValue<float>((QPromise<float> *)&local_80,pfVar5);
    pfVar5 = (float *)&(anonymous_namespace)::kRes;
    local_70._0_4_ = fVar6;
    cVar4 = QTest::qCompare((float *)&local_70,(float *)&(anonymous_namespace)::kRes,
                            "waitForValue(p0, kFail)","kRes",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xc5);
    if (cVar4 != '\0') {
      local_70._0_4_ = waitForValue<float>((QPromise<float> *)&local_90,pfVar5);
      pfVar5 = (float *)&(anonymous_namespace)::kRes;
      cVar4 = QTest::qCompare((float *)&local_70,(float *)&(anonymous_namespace)::kRes,
                              "waitForValue(p1, kFail)","kRes",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                              ,0xc6);
      if (cVar4 != '\0') {
        local_70._0_4_ = waitForValue<float>((QPromise<float> *)&local_a0,pfVar5);
        QTest::qCompare((float *)&local_70,(float *)&(anonymous_namespace)::kRes,
                        "waitForValue(p2, kFail)","kRes",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                        ,199);
      }
    }
    local_a0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
    if (local_a0.m_d.d != (PromiseData<float> *)0x0) {
      LOCK();
      pQVar1 = &((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_a0.m_d.d != (PromiseData<float> *)0x0)) {
        (*((local_a0.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
    local_90._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
    if (local_90.m_d.d != (PromiseData<float> *)0x0) {
      LOCK();
      pQVar1 = &((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_90.m_d.d != (PromiseData<float> *)0x0)) {
        (*((local_90.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
    local_80._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001337f0;
    if (local_80.m_d.d != (PromiseData<float> *)0x0) {
      LOCK();
      pQVar1 = &((local_80.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
                super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_80.m_d.d != (PromiseData<float> *)0x0)) {
        (*((local_80.m_d.d)->super_PromiseDataBase<float,_void_(const_float_&)>).
          _vptr_PromiseDataBase[1])();
      }
    }
  }
  return;
}

Assistant:

void tst_qpromise_then::functionPtrHandlers()
{
    { // Global functions.
        auto p0 = QtPromise::resolve().then(&fnNoArg);
        auto p1 = QtPromise::resolve(kRes).then(&fnArgByVal);
        auto p2 = QtPromise::resolve(kRes).then(&fnArgByRef);

        QCOMPARE(waitForValue(p0, kFail), kRes);
        QCOMPARE(waitForValue(p1, kFail), kRes);
        QCOMPARE(waitForValue(p2, kFail), kRes);
    }
    { // Static member functions.
        auto p0 = QtPromise::resolve().then(&Klass::kFnNoArg);
        auto p1 = QtPromise::resolve(kRes).then(&Klass::kFnArgByVal);
        auto p2 = QtPromise::resolve(kRes).then(&Klass::kFnArgByRef);

        QCOMPARE(waitForValue(p0, kFail), kRes);
        QCOMPARE(waitForValue(p1, kFail), kRes);
        QCOMPARE(waitForValue(p2, kFail), kRes);
    }
}